

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GoalSymbol.h
# Opt level: O0

void __thiscall GoalSymbol::set_type(GoalSymbol *this,TypeSpec *ts)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long in_RDI;
  TypeSpec *in_stack_ffffffffffffff78;
  TypeSpec *in_stack_ffffffffffffff80;
  string local_50 [32];
  string local_30 [24];
  TypeSpec *in_stack_ffffffffffffffe8;
  
  if (((*(byte *)(in_RDI + 0x58) & 1) != 0) &&
     (bVar1 = TypeSpec::operator!=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78), bVar1)) {
    uVar2 = std::__cxx11::string::c_str();
    TypeSpec::to_string_abi_cxx11_(in_stack_ffffffffffffffe8);
    uVar3 = std::__cxx11::string::c_str();
    TypeSpec::to_string_abi_cxx11_(in_stack_ffffffffffffffe8);
    uVar4 = std::__cxx11::string::c_str();
    printf("symbol %s %s -> %s",uVar2,uVar3,uVar4);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string(local_30);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/TypeSystem/GoalSymbol.h"
                  ,0x18,"void GoalSymbol::set_type(TypeSpec)");
  }
  *(undefined1 *)(in_RDI + 0x58) = 1;
  TypeSpec::operator=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  return;
}

Assistant:

void set_type(TypeSpec ts) {
    if(m_has_type_info) {
      if(ts != m_type) {
        printf("symbol %s %s -> %s", m_name.c_str(), m_type.to_string().c_str(), ts.to_string().c_str());
        assert(false);
      }
    }

    m_has_type_info = true;
    m_type = std::move(ts);
  }